

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

String xmrig::OclLib::getString(cl_platform_id platform,cl_platform_info param_name)

{
  char *in_RDI;
  String SVar1;
  uint in_stack_0000000c;
  undefined4 in_stack_00000010;
  
  SVar1 = getOclString<int(*)(_cl_platform_id*,unsigned_int,unsigned_long,void*,unsigned_long*),_cl_platform_id*,unsigned_int>
                    ((_func_int__cl_platform_id_ptr_uint_unsigned_long_void_ptr_unsigned_long_ptr *)
                     platform,(_cl_platform_id *)CONCAT44(param_name,in_stack_00000010),
                     in_stack_0000000c);
  SVar1.m_data = in_RDI;
  return SVar1;
}

Assistant:

xmrig::String xmrig::OclLib::getString(cl_platform_id platform, cl_platform_info param_name) noexcept
{
    return getOclString(OclLib::getPlatformInfo, platform, param_name);
}